

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

int Gia_ManDecideWhereToAdd(Gia_Man_t *p,Vec_Int_t **vPart,Gia_Obj_t **pFan)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if ((*vPart)->nSize == vPart[1]->nSize) {
    if ((*vPart)->nSize < 1) {
      iVar2 = 0;
      iVar1 = 1;
    }
    else {
      iVar1 = Gia_ObjId(p,*pFan);
      iVar2 = Gia_ManCountMark0Dfs(p,iVar1);
      iVar1 = Gia_ObjId(p,pFan[1]);
      iVar1 = Gia_ManCountMark1Dfs(p,iVar1);
      iVar1 = iVar1 + iVar2;
      iVar2 = Gia_ObjId(p,pFan[1]);
      iVar3 = Gia_ManCountMark0Dfs(p,iVar2);
      iVar2 = Gia_ObjId(p,*pFan);
      iVar2 = Gia_ManCountMark1Dfs(p,iVar2);
      iVar2 = iVar2 + iVar3;
    }
    return (int)(iVar1 < iVar2);
  }
  __assert_fail("Vec_IntSize(vPart[0]) == Vec_IntSize(vPart[1])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x1146,"int Gia_ManDecideWhereToAdd(Gia_Man_t *, Vec_Int_t **, Gia_Obj_t **)");
}

Assistant:

int Gia_ManDecideWhereToAdd( Gia_Man_t * p, Vec_Int_t * vPart[2], Gia_Obj_t * pFan[2] )
{
    int Count0 = 1, Count1 = 0;
    assert( Vec_IntSize(vPart[0]) == Vec_IntSize(vPart[1]) );
    if ( Vec_IntSize(vPart[0]) > 0 )
    {
        Count0 = Gia_ManCountMark0Dfs(p, Gia_ObjId(p, pFan[0])) + Gia_ManCountMark1Dfs(p, Gia_ObjId(p, pFan[1]));
        Count1 = Gia_ManCountMark0Dfs(p, Gia_ObjId(p, pFan[1])) + Gia_ManCountMark1Dfs(p, Gia_ObjId(p, pFan[0]));
    }
    return Count0 < Count1;
}